

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BCD.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     aaas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (RegisterPair16 *ax,Context *context)

{
  bool bVar1;
  Context *context_local;
  RegisterPair16 *ax_local;
  
  if (((ax->halves).low & 0xf) < 10) {
    bVar1 = Flags::flag<(InstructionSet::x86::Flag)1>(&context->flags);
    if (!bVar1) {
      Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,0);
      goto LAB_007d9a82;
    }
  }
  (ax->halves).low = (ax->halves).low + '\x06';
  (ax->halves).high = (ax->halves).high + '\x01';
  Flags::set_from<(InstructionSet::x86::Flag)0,(InstructionSet::x86::Flag)1>(&context->flags,1);
LAB_007d9a82:
  (ax->halves).low = (ax->halves).low & 0xf;
  return;
}

Assistant:

void aaas(
	CPU::RegisterPair16 &ax,
	ContextT &context
) {
	if((ax.halves.low & 0x0f) > 9 || context.flags.template flag<Flag::AuxiliaryCarry>()) {
		if constexpr (add) {
			ax.halves.low += 6;
			++ax.halves.high;
		} else {
			ax.halves.low -= 6;
			--ax.halves.high;
		}
		context.flags.template set_from<Flag::Carry, Flag::AuxiliaryCarry>(1);
	} else {
		context.flags.template set_from<Flag::Carry>(0);
	}
	ax.halves.low &= 0x0f;
}